

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20M303DLHC::setCompassCRA(RTIMUGD20M303DLHC *this)

{
  uchar cra;
  RTIMUGD20M303DLHC *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_GD20M303DLHCCompassSampleRate < 0) ||
     (7 < ((this->super_RTIMU).m_settings)->m_GD20M303DLHCCompassSampleRate)) {
    fprintf(_stderr,"Illegal LSM303DLHC compass sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20M303DLHCCompassSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_compassSlaveAddr,'\0',
                            (uchar)(((this->super_RTIMU).m_settings)->
                                    m_GD20M303DLHCCompassSampleRate << 2),
                            "Failed to set LSM303DLHC CRA_M");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20M303DLHC::setCompassCRA()
{
    unsigned char cra;

    if ((m_settings->m_GD20M303DLHCCompassSampleRate < 0) || (m_settings->m_GD20M303DLHCCompassSampleRate > 7)) {
        HAL_ERROR1("Illegal LSM303DLHC compass sample rate code %d\n", m_settings->m_GD20M303DLHCCompassSampleRate);
        return false;
    }

    cra = (m_settings->m_GD20M303DLHCCompassSampleRate << 2);

    return m_settings->HALWrite(m_compassSlaveAddr,  LSM303DLHC_CRA_M, cra, "Failed to set LSM303DLHC CRA_M");
}